

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O3

int run_test_metrics_idle_time(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  int64_t eval_b;
  int64_t eval_a;
  int cntr;
  uv_timer_t timer;
  long local_90;
  int local_84;
  int *local_80 [15];
  
  local_80[0] = &local_84;
  local_84 = 0;
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_configure(uVar2,1);
  local_90 = (long)iVar1;
  if (local_90 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,local_80);
    local_90 = (long)iVar1;
    if (local_90 != 0) goto LAB_001acb6e;
    iVar1 = uv_timer_start(local_80,timer_spin_cb,1000,0);
    local_90 = (long)iVar1;
    if (local_90 != 0) goto LAB_001acb7b;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    local_90 = (long)iVar1;
    if (local_90 != 0) goto LAB_001acb88;
    local_90 = (long)local_84;
    if (local_90 < 1) goto LAB_001acb95;
    uVar2 = uv_default_loop();
    local_90 = uv_metrics_idle_time(uVar2);
    if (1500000000 < local_90) goto LAB_001acba2;
    if (499999999 < local_90) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_90 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (local_90 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001acbbc;
    }
  }
  else {
    run_test_metrics_idle_time_cold_1();
LAB_001acb6e:
    run_test_metrics_idle_time_cold_2();
LAB_001acb7b:
    run_test_metrics_idle_time_cold_3();
LAB_001acb88:
    run_test_metrics_idle_time_cold_4();
LAB_001acb95:
    run_test_metrics_idle_time_cold_5();
LAB_001acba2:
    run_test_metrics_idle_time_cold_8();
  }
  run_test_metrics_idle_time_cold_7();
LAB_001acbbc:
  plVar5 = &local_90;
  run_test_metrics_idle_time_cold_6();
  *(int *)*plVar5 = *(int *)*plVar5 + 1;
  lVar3 = uv_hrtime();
  do {
    lVar4 = uv_hrtime();
  } while ((ulong)(lVar4 - lVar3) < 600000000);
  return (int)(lVar4 - lVar3);
}

Assistant:

TEST_IMPL(metrics_idle_time) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
  const uint64_t timeout = 1000;
  uv_timer_t timer;
  uint64_t idle_time;
  int cntr;

  cntr = 0;
  timer.data = &cntr;

  ASSERT_OK(uv_loop_configure(uv_default_loop(), UV_METRICS_IDLE_TIME));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_spin_cb, timeout, 0));

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_GT(cntr, 0);

  idle_time = uv_metrics_idle_time(uv_default_loop());

  /* Permissive check that the idle time matches within the timeout ±500 ms. */
  ASSERT_LE(idle_time, (timeout + 500) * UV_NS_TO_MS);
  ASSERT_GE(idle_time, (timeout - 500) * UV_NS_TO_MS);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}